

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall cs_impl::fiber::Routine::~Routine(Routine *this)

{
  if (this->stack != (char *)0x0) {
    operator_delete__(this->stack);
  }
  std::_Function_base::~_Function_base(&(this->func).super__Function_base);
  cs::stack_type<cs::domain_type,_std::allocator>::~stack_type(&this->cs_stack);
  std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::~unique_ptr
            (&this->cs_pcontext);
  return;
}

Assistant:

~Routine()
			{
				delete[] stack;
			}